

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::IsPolylineVertexInside
          (CrossingProcessor *this,bool matches_polyline,bool matches_polygon)

{
  bool local_13;
  bool contained;
  bool matches_polygon_local;
  bool matches_polyline_local;
  CrossingProcessor *this_local;
  
  local_13 = (this->inside_ & 1U) != (this->invert_b_ & 1U);
  if ((matches_polyline) && ((this->is_union_ & 1U) == 0)) {
    local_13 = true;
  }
  else if ((matches_polygon) && (this->polygon_model_ != SEMI_OPEN)) {
    local_13 = this->polygon_model_ == CLOSED;
  }
  return local_13 != (bool)(this->invert_b_ & 1U);
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::IsPolylineVertexInside(
    bool matches_polyline, bool matches_polygon) const {
  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;

  // For UNION the output includes duplicate polylines.  The test below
  // ensures that isolated polyline vertices are not suppressed by other
  // polyline vertices in the output.
  if (matches_polyline && !is_union_) {
    contained = true;
  } else if (matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  // Finally, invert the result if the opposite region should be inverted.
  return contained ^ invert_b_;
}